

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

bool __thiscall Game::OnUserUpdate(Game *this,float fElapsedTime)

{
  bool bVar1;
  HWButton HVar2;
  int32_t iVar3;
  int iVar4;
  int32_t iVar5;
  vi2d *v;
  Sprite *pSVar6;
  float *pfVar7;
  reference pvVar8;
  element_type *peVar9;
  reference this_00;
  Decal *pDVar10;
  float fVar11;
  byte local_941;
  byte local_899;
  v2d_generic<float> local_888;
  v2d_generic<float> local_880;
  anon_union_4_2_12391da5_for_Pixel_0 local_878;
  v2d_generic<float> local_874;
  v2d_generic<float> local_86c;
  v2d_generic<float> local_864;
  anon_union_4_2_12391da5_for_Pixel_0 local_85c;
  string local_858;
  v2d_generic<float> local_838;
  v2d_generic<float> local_830;
  v2d_generic<float> local_828;
  v2d_generic<float> local_820;
  v2d_generic<float> local_818;
  v2d_generic<float> local_810;
  v2d_generic<float> local_808;
  v2d_generic<float> local_800;
  v2d_generic<float> local_7f8;
  v2d_generic<float> local_7f0;
  v2d_generic<float> local_7e8;
  v2d_generic<float> local_7e0;
  v2d_generic<float> local_7d8;
  v2d_generic<float> local_7d0;
  v2d_generic<float> local_7c8;
  v2d_generic<float> local_7c0;
  v2d_generic<float> local_7b8;
  int local_7b0;
  anon_union_4_2_12391da5_for_Pixel_0 local_7ac;
  int nextMinigame;
  v2d_generic<float> local_7a0;
  float local_798;
  float local_794;
  float fadeoutColor;
  v2d_generic<float> local_788;
  v2d_generic<float> local_780;
  v2d_generic<float> local_778;
  v2d_generic<float> local_770;
  v2d_generic<float> local_768;
  v2d_generic<float> local_760;
  v2d_generic<float> local_758;
  v2d_generic<float> local_750;
  v2d_generic<float> local_748;
  v2d_generic<float> local_740;
  v2d_generic<float> local_738;
  v2d_generic<float> local_730;
  v2d_generic<float> local_728;
  v2d_generic<float> local_720;
  v2d_generic<float> local_718;
  v2d_generic<float> local_710;
  v2d_generic<float> local_708;
  v2d_generic<float> local_700;
  v2d_generic<float> local_6f8;
  v2d_generic<float> local_6f0;
  v2d_generic<float> local_6e8;
  shared_ptr<olc::Renderable> local_6e0;
  v2d_generic<int> local_6cc;
  v2d_generic<int> local_6c4;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  SpeechBubble local_670;
  shared_ptr<olc::Renderable> local_580;
  v2d_generic<int> local_56c;
  v2d_generic<int> local_564;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  SpeechBubble local_510;
  undefined2 local_41e;
  undefined1 local_41c;
  undefined2 local_41b;
  undefined1 local_419;
  shared_ptr<olc::Renderable> local_418;
  v2d_generic<int> local_404;
  v2d_generic<int> local_3fc;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  SpeechBubble local_3a8;
  shared_ptr<olc::Renderable> local_2b8;
  v2d_generic<int> local_2a4;
  v2d_generic<int> local_29c;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  SpeechBubble local_248;
  anon_union_4_2_12391da5_for_Pixel_0 local_154;
  v2d_generic<float> local_150;
  v2d_generic<float> local_148;
  v2d_generic<float> local_140;
  anon_union_4_2_12391da5_for_Pixel_0 local_138;
  allocator<char> local_131;
  string local_130;
  undefined4 local_110;
  allocator<char> local_109;
  string local_108 [36];
  undefined1 local_e4 [16];
  v2d_generic local_d4 [8];
  v2d_generic<float> local_cc;
  v2d_generic<float> local_c4;
  anon_union_4_2_12391da5_for_Pixel_0 local_bc;
  v2d_generic<float> local_b8;
  v2d_generic<float> local_b0;
  v2d_generic<float> local_a8;
  anon_union_4_2_12391da5_for_Pixel_0 local_a0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [36];
  v2d_generic<int> local_1c;
  vi2d mousePos;
  float fElapsedTime_local;
  Game *this_local;
  
  mousePos.x = (int)fElapsedTime;
  unique0x1000216c = this;
  switch(this->state) {
  case MENU:
    v = olc::PixelGameEngine::GetMousePos(&this->super_PixelGameEngine);
    olc::v2d_generic<int>::v2d_generic(&local_1c,v);
    iVar4 = local_1c.x;
    iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    local_899 = 0;
    if (iVar3 / 2 + -0x32 <= iVar4) {
      iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
      iVar4 = local_1c.y;
      local_899 = 0;
      if (local_1c.x <= iVar3 / 2 + 0x32) {
        iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_899 = 0;
        if (iVar3 / 2 + -10 <= iVar4) {
          iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
          local_899 = 0;
          if (local_1c.y <= iVar3 / 2 + 10) {
            HVar2 = olc::PixelGameEngine::GetMouse(&this->super_PixelGameEngine,0);
            local_40._33_2_ = HVar2._0_2_;
            local_40[0x23] = HVar2.bHeld;
            local_899 = 0;
            if (((uint3)HVar2 & 1) != 0) {
              local_899 = this->started ^ 0xff;
            }
          }
        }
      }
    }
    if ((local_899 & 1) != 0) {
      this->started = true;
    }
    if ((this->started & 1U) != 0) {
      this->menuFadeTimer = (float)mousePos.x + this->menuFadeTimer;
    }
    if (2.0 <= this->menuFadeTimer) {
      this->state = FIRST_PHASE;
    }
    iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    olc::v2d_generic<float>::v2d_generic
              ((v2d_generic<float> *)(local_40 + 0x10),(float)(iVar3 / 2),40.0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_60,"The Great\n   MMO  \n Machine ",&local_61);
    olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_40,(string *)this);
    olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)(local_40 + 8));
    olc::v2d_generic<float>::operator-
              ((v2d_generic<float> *)(local_40 + 0x18),(v2d_generic<float> *)(local_40 + 0x10));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"The Great\n   MMO  \n Machine ",&local_99);
    local_a0 = olc::BLUE;
    olc::v2d_generic<float>::v2d_generic(&local_a8,2.0,2.0);
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,(vf2d *)(local_40 + 0x18),&local_98,
               (Pixel)local_a0.field_1,&local_a8);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
    iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar5 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    olc::v2d_generic<float>::v2d_generic
              (&local_b0,(float)(iVar3 / 2) + -50.0,(float)(iVar5 / 2) + -10.0);
    olc::v2d_generic<float>::v2d_generic(&local_b8,100.0,20.0);
    local_bc = olc::WHITE;
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,&local_b0,&local_b8,(Pixel)olc::WHITE.field_1);
    iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar5 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    olc::v2d_generic<float>::v2d_generic(&local_cc,(float)(iVar3 / 2),(float)(iVar5 / 2));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_108,"Play",&local_109);
    olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_e4,(string *)this);
    local_110 = 2;
    olc::v2d_generic<int>::operator/((v2d_generic<int> *)(local_e4 + 8),(int *)local_e4);
    olc::v2d_generic::operator_cast_to_v2d_generic(local_d4);
    olc::v2d_generic<float>::operator-(&local_c4,&local_cc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Play",&local_131);
    local_138 = olc::BLUE;
    olc::v2d_generic<float>::v2d_generic(&local_140,1.0,1.0);
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,&local_c4,&local_130,(Pixel)local_138.field_1,&local_140
              );
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
    olc::v2d_generic<float>::v2d_generic(&local_148,0.0,0.0);
    iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar5 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    olc::v2d_generic<float>::v2d_generic(&local_150,(float)iVar3,(float)iVar5);
    local_154.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1)
         olc::PixelF(0.0,0.0,0.0,this->menuFadeTimer / 2.0);
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,&local_148,&local_150,(Pixel)local_154.field_1);
    break;
  case FIRST_PHASE:
    switch(this->cutsceneState) {
    case 0:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,"Hmm, I really need a new\nvideo idea...",&local_269);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"res/sounds/hmm.wav",&local_291);
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<int>::v2d_generic(&local_29c,0x46,iVar3 + -0x40);
      iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
      olc::v2d_generic<int>::v2d_generic(&local_2a4,iVar3 + -0x4c,0x40);
      std::shared_ptr<olc::Renderable>::shared_ptr(&local_2b8,&this->speechBubbleSprite);
      SpeechBubble::SpeechBubble(&local_248,&local_268,&local_290,&local_29c,&local_2a4,&local_2b8);
      SpeechBubble::operator=(&this->currentSpeechBubble,&local_248);
      SpeechBubble::~SpeechBubble(&local_248);
      std::shared_ptr<olc::Renderable>::~shared_ptr(&local_2b8);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator(&local_291);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator(&local_269);
      SpeechBubble::play(&this->currentSpeechBubble,&this->soloud);
      this->cutsceneState = 1;
      break;
    case 1:
      fVar11 = SpeechBubble::getTimePastEnd(&this->currentSpeechBubble);
      if (3.0 <= fVar11) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"I know, I\'m gonna make an mmo",&local_3c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"res/sounds/iknow.wav",&local_3f1);
        iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        olc::v2d_generic<int>::v2d_generic(&local_3fc,0x46,iVar3 + -0x40);
        iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        olc::v2d_generic<int>::v2d_generic(&local_404,iVar3 + -0x4c,0x40);
        std::shared_ptr<olc::Renderable>::shared_ptr(&local_418,&this->speechBubbleSprite);
        SpeechBubble::SpeechBubble
                  (&local_3a8,&local_3c8,&local_3f0,&local_3fc,&local_404,&local_418);
        SpeechBubble::operator=(&this->currentSpeechBubble,&local_3a8);
        SpeechBubble::~SpeechBubble(&local_3a8);
        std::shared_ptr<olc::Renderable>::~shared_ptr(&local_418);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator(&local_3c9);
        SpeechBubble::play(&this->currentSpeechBubble,&this->soloud);
        this->cutsceneState = 2;
      }
      break;
    case 2:
      fVar11 = SpeechBubble::getTimePastEnd(&this->currentSpeechBubble);
      if (3.0 <= fVar11) {
        this->cutsceneState = 3;
      }
      break;
    case 3:
      HVar2 = olc::PixelGameEngine::GetKey(&this->super_PixelGameEngine,A);
      local_41b = HVar2._0_2_;
      local_419 = HVar2.bHeld;
      if (((uint3)HVar2 & 1) != 0) {
        this->aPressed = true;
      }
      HVar2 = olc::PixelGameEngine::GetKey(&this->super_PixelGameEngine,D);
      local_41e = HVar2._0_2_;
      local_41c = HVar2.bHeld;
      local_941 = 0;
      if (((uint3)HVar2 & 1) != 0) {
        local_941 = this->aPressed;
      }
      if ((local_941 & 1) != 0) {
        StatusBar::addWork(&this->statusBar);
        this->aPressed = false;
        this->pressCounter = this->pressCounter + 1;
      }
      if (this->pressCounter == 0x1e) {
        this->cutsceneState = 4;
      }
      break;
    case 4:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_530,"Eugh, this is going slowly",&local_531);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,"res/sounds/eughh.wav",&local_559);
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<int>::v2d_generic(&local_564,0x46,iVar3 + -0x40);
      iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
      olc::v2d_generic<int>::v2d_generic(&local_56c,iVar3 + -0x4c,0x40);
      std::shared_ptr<olc::Renderable>::shared_ptr(&local_580,&this->speechBubbleSprite);
      SpeechBubble::SpeechBubble(&local_510,&local_530,&local_558,&local_564,&local_56c,&local_580);
      SpeechBubble::operator=(&this->currentSpeechBubble,&local_510);
      SpeechBubble::~SpeechBubble(&local_510);
      std::shared_ptr<olc::Renderable>::~shared_ptr(&local_580);
      std::__cxx11::string::~string((string *)&local_558);
      std::allocator<char>::~allocator(&local_559);
      std::__cxx11::string::~string((string *)&local_530);
      std::allocator<char>::~allocator(&local_531);
      SpeechBubble::play(&this->currentSpeechBubble,&this->soloud);
      this->cutsceneState = 5;
      break;
    case 5:
      fVar11 = SpeechBubble::getTimePastEnd(&this->currentSpeechBubble);
      if (3.0 <= fVar11) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_690,
                   "I know, I\'m gonna make an mmo\nmaking machine, there\'s no\nway that goes wrong"
                   ,&local_691);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6b8,"res/sounds/mmo.wav",&local_6b9);
        iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        olc::v2d_generic<int>::v2d_generic(&local_6c4,0x46,iVar3 + -0x40);
        iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        olc::v2d_generic<int>::v2d_generic(&local_6cc,iVar3 + -0x4c,0x40);
        std::shared_ptr<olc::Renderable>::shared_ptr(&local_6e0,&this->speechBubbleSprite);
        SpeechBubble::SpeechBubble
                  (&local_670,&local_690,&local_6b8,&local_6c4,&local_6cc,&local_6e0);
        SpeechBubble::operator=(&this->currentSpeechBubble,&local_670);
        SpeechBubble::~SpeechBubble(&local_670);
        std::shared_ptr<olc::Renderable>::~shared_ptr(&local_6e0);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::allocator<char>::~allocator(&local_6b9);
        std::__cxx11::string::~string((string *)&local_690);
        std::allocator<char>::~allocator(&local_691);
        SpeechBubble::play(&this->currentSpeechBubble,&this->soloud);
        this->cutsceneState = 6;
      }
      break;
    case 6:
      fVar11 = SpeechBubble::getTimePastEnd(&this->currentSpeechBubble);
      if (3.0 <= fVar11) {
        this->cutsceneState = 7;
      }
      break;
    case 7:
      this->fadeoutTimer = fElapsedTime + this->fadeoutTimer;
      if (4.0 <= this->fadeoutTimer) {
        this->state = MACHINE;
      }
    }
    SpeechBubble::tick(&this->currentSpeechBubble,(float)mousePos.x);
    iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    olc::v2d_generic<float>::v2d_generic(&local_6e8,0.0,(float)iVar3 - 64.0);
    pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->javidBaseSprite);
    olc::v2d_generic<float>::v2d_generic(&local_6f0,2.0,2.0);
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,&local_6e8,pDVar10,&local_6f0,
               (Pixel *)&olc::WHITE.field_1);
    if (this->cutsceneState == 3) {
      if ((this->aPressed & 1U) == 0) {
        iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        pSVar6 = olc::Renderable::Sprite(&this->aButtonSprite);
        iVar4 = pSVar6->width;
        iVar5 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar6 = olc::Renderable::Sprite(&this->aButtonSprite);
        olc::v2d_generic<float>::v2d_generic
                  (&local_738,(float)((iVar3 / 2 + -0x28) - iVar4),
                   (float)(iVar5 / 2 - pSVar6->height / 2));
        pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->aButtonSprite);
        olc::v2d_generic<float>::v2d_generic(&local_740,1.0,1.0);
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,&local_738,pDVar10,&local_740,
                   (Pixel *)&olc::WHITE.field_1);
        iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        iVar5 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar6 = olc::Renderable::Sprite(&this->dButtonSprite);
        olc::v2d_generic<float>::v2d_generic
                  (&local_748,(float)(iVar3 / 2 + 0x28),(float)(iVar5 / 2 - pSVar6->height / 2));
        pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->dButtonPressedSprite);
        olc::v2d_generic<float>::v2d_generic(&local_750,1.0,1.0);
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,&local_748,pDVar10,&local_750,
                   (Pixel *)&olc::WHITE.field_1);
        iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        olc::v2d_generic<float>::v2d_generic(&local_758,0.0,(float)iVar3 - 64.0);
        pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmUpSprite);
        olc::v2d_generic<float>::v2d_generic(&local_760,2.0,2.0);
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,&local_758,pDVar10,&local_760,
                   (Pixel *)&olc::WHITE.field_1);
        iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        olc::v2d_generic<float>::v2d_generic(&local_768,0.0,(float)iVar3 - 64.0);
        pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->javidLArmDownSprite);
        olc::v2d_generic<float>::v2d_generic(&local_770,2.0,2.0);
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,&local_768,pDVar10,&local_770,
                   (Pixel *)&olc::WHITE.field_1);
      }
      else {
        iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        pSVar6 = olc::Renderable::Sprite(&this->aButtonSprite);
        iVar4 = pSVar6->width;
        iVar5 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar6 = olc::Renderable::Sprite(&this->aButtonSprite);
        olc::v2d_generic<float>::v2d_generic
                  (&local_6f8,(float)((iVar3 / 2 + -0x28) - iVar4),
                   (float)(iVar5 / 2 - pSVar6->height / 2));
        pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->aButtonPressedSprite);
        olc::v2d_generic<float>::v2d_generic(&local_700,1.0,1.0);
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,&local_6f8,pDVar10,&local_700,
                   (Pixel *)&olc::WHITE.field_1);
        iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        iVar5 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar6 = olc::Renderable::Sprite(&this->dButtonSprite);
        olc::v2d_generic<float>::v2d_generic
                  (&local_708,(float)(iVar3 / 2 + 0x28),(float)(iVar5 / 2 - pSVar6->height / 2));
        pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->dButtonSprite);
        olc::v2d_generic<float>::v2d_generic(&local_710,1.0,1.0);
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,&local_708,pDVar10,&local_710,
                   (Pixel *)&olc::WHITE.field_1);
        iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        olc::v2d_generic<float>::v2d_generic(&local_718,0.0,(float)iVar3 - 64.0);
        pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmDownSprite);
        olc::v2d_generic<float>::v2d_generic(&local_720,2.0,2.0);
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,&local_718,pDVar10,&local_720,
                   (Pixel *)&olc::WHITE.field_1);
        iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        olc::v2d_generic<float>::v2d_generic(&local_728,0.0,(float)iVar3 - 64.0);
        pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->javidLArmUpSprite);
        olc::v2d_generic<float>::v2d_generic(&local_730,2.0,2.0);
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,&local_728,pDVar10,&local_730,
                   (Pixel *)&olc::WHITE.field_1);
      }
    }
    else {
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<float>::v2d_generic(&local_778,0.0,(float)iVar3 - 64.0);
      pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmDownSprite);
      olc::v2d_generic<float>::v2d_generic(&local_780,2.0,2.0);
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,&local_778,pDVar10,&local_780,
                 (Pixel *)&olc::WHITE.field_1);
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<float>::v2d_generic(&local_788,0.0,(float)iVar3 - 64.0);
      pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->javidLArmDownSprite);
      olc::v2d_generic<float>::v2d_generic((v2d_generic<float> *)&stack0xfffffffffffff870,2.0,2.0);
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,&local_788,pDVar10,(vf2d *)&stack0xfffffffffffff870,
                 (Pixel *)&olc::WHITE.field_1);
      SpeechBubble::drawSelf(&this->currentSpeechBubble,&this->super_PixelGameEngine);
    }
    StatusBar::drawSelf(&this->statusBar,&this->super_PixelGameEngine);
    local_798 = 3.0;
    pfVar7 = std::min<float>(&local_798,&this->fadeoutTimer);
    local_794 = *pfVar7 / 3.0;
    olc::v2d_generic<float>::v2d_generic(&local_7a0,0.0,0.0);
    iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar5 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    olc::v2d_generic<float>::v2d_generic
              ((v2d_generic<float> *)&nextMinigame,(float)iVar3,(float)iVar5);
    local_7ac.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1)
         olc::PixelF(0.0,0.0,0.0,local_794);
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,&local_7a0,(vf2d *)&nextMinigame,
               (Pixel)local_7ac.field_1);
    break;
  case MACHINE:
    this->minigameTimer = this->minigameTimer - fElapsedTime;
    if (this->minigameTimer <= 0.0) {
      this->minigameTimer = 10.0;
      local_7b0 = std::uniform_int_distribution<int>::operator()
                            (&this->minigameDistrib,&this->engine);
      while (local_7b0 == this->curMinigameId) {
        local_7b0 = std::uniform_int_distribution<int>::operator()
                              (&this->minigameDistrib,&this->engine);
      }
      pvVar8 = std::vector<std::shared_ptr<Minigame>,_std::allocator<std::shared_ptr<Minigame>_>_>::
               operator[](&this->minigames,(long)local_7b0);
      std::shared_ptr<Minigame>::operator=(&this->currentMinigame,pvVar8);
      this->curMinigameId = local_7b0;
      peVar9 = std::__shared_ptr_access<Minigame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Minigame,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&this->currentMinigame);
      (**peVar9->_vptr_Minigame)();
    }
    this->armSwitchTimer = (float)mousePos.x + this->armSwitchTimer;
    this->headBobTimer = (float)mousePos.x + this->headBobTimer;
    peVar9 = std::__shared_ptr_access<Minigame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Minigame,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->currentMinigame);
    (*peVar9->_vptr_Minigame[1])(peVar9,this,&this->internetPoints);
    if (this->internetPoints < 0) {
      this->internetPoints = 0;
    }
    bVar1 = SkillTree::tick(&this->skillTree,&this->super_PixelGameEngine,&this->internetPoints);
    if (bVar1) {
      this->armSwitchPeriod = this->armSwitchPeriod * 0.7;
    }
    StatusBar::tick(&this->statusBar,&this->super_PixelGameEngine);
    if (this->headBobPeriod / 2.0 < this->headBobTimer) {
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<float>::v2d_generic(&local_7c8,0.0,(float)iVar3 - 64.0);
      pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->robotBaseSprite1);
      olc::v2d_generic<float>::v2d_generic(&local_7d0,2.0,2.0);
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,&local_7c8,pDVar10,&local_7d0,
                 (Pixel *)&olc::WHITE.field_1);
    }
    else {
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<float>::v2d_generic(&local_7b8,0.0,(float)iVar3 - 64.0);
      pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->robotBaseSprite0);
      olc::v2d_generic<float>::v2d_generic(&local_7c0,2.0,2.0);
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,&local_7b8,pDVar10,&local_7c0,
                 (Pixel *)&olc::WHITE.field_1);
    }
    if (this->headBobPeriod <= this->headBobTimer) {
      this->headBobTimer = this->headBobTimer - this->headBobPeriod;
    }
    if (this->armSwitchPeriod < 0.016) {
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<float>::v2d_generic(&local_818,0.0,(float)iVar3 - 64.0);
      iVar4 = rand();
      this_00 = std::vector<olc::Renderable,_std::allocator<olc::Renderable>_>::operator[]
                          (&this->fastHandSprites,(long)(iVar4 % 3));
      pDVar10 = olc::Renderable::operator_cast_to_Decal_(this_00);
      olc::v2d_generic<float>::v2d_generic(&local_820,2.0,2.0);
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,&local_818,pDVar10,&local_820,
                 (Pixel *)&olc::WHITE.field_1);
    }
    else if (this->armSwitchPeriod / 2.0 < this->armSwitchTimer) {
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<float>::v2d_generic(&local_7f8,0.0,(float)iVar3 - 64.0);
      pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->robotRArmUpSprite);
      olc::v2d_generic<float>::v2d_generic(&local_800,2.0,2.0);
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,&local_7f8,pDVar10,&local_800,
                 (Pixel *)&olc::WHITE.field_1);
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<float>::v2d_generic(&local_808,0.0,(float)iVar3 - 64.0);
      pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->robotLArmDownSprite);
      olc::v2d_generic<float>::v2d_generic(&local_810,2.0,2.0);
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,&local_808,pDVar10,&local_810,
                 (Pixel *)&olc::WHITE.field_1);
    }
    else {
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<float>::v2d_generic(&local_7d8,0.0,(float)iVar3 - 64.0);
      pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->robotRArmDownSprite);
      olc::v2d_generic<float>::v2d_generic(&local_7e0,2.0,2.0);
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,&local_7d8,pDVar10,&local_7e0,
                 (Pixel *)&olc::WHITE.field_1);
      iVar3 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      olc::v2d_generic<float>::v2d_generic(&local_7e8,0.0,(float)iVar3 - 64.0);
      pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->robotLArmUpSprite);
      olc::v2d_generic<float>::v2d_generic(&local_7f0,2.0,2.0);
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,&local_7e8,pDVar10,&local_7f0,
                 (Pixel *)&olc::WHITE.field_1);
    }
    while (this->armSwitchPeriod <= this->armSwitchTimer) {
      this->armSwitchTimer = this->armSwitchTimer - this->armSwitchPeriod;
      StatusBar::addWork(&this->statusBar);
    }
    peVar9 = std::__shared_ptr_access<Minigame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Minigame,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->currentMinigame);
    (*peVar9->_vptr_Minigame[2])(peVar9,this);
    olc::v2d_generic<float>::v2d_generic(&local_828,0.0,5.0);
    pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->ipSprite);
    olc::v2d_generic<float>::v2d_generic(&local_830,1.0,1.0);
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,&local_828,pDVar10,&local_830,
               (Pixel *)&olc::WHITE.field_1);
    olc::v2d_generic<float>::v2d_generic(&local_838,16.0,9.0);
    std::__cxx11::to_string(&local_858,this->internetPoints);
    local_85c = olc::WHITE;
    olc::v2d_generic<float>::v2d_generic(&local_864,1.0,1.0);
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,&local_838,&local_858,(Pixel)local_85c.field_1,
               &local_864);
    std::__cxx11::string::~string((string *)&local_858);
    SkillTree::drawSelf(&this->skillTree,&this->super_PixelGameEngine,&this->internetPoints);
    StatusBar::drawSelf(&this->statusBar,&this->super_PixelGameEngine);
    bVar1 = StatusBar::done(&this->statusBar);
    if (bVar1) {
      this->winFadeTimer = (float)mousePos.x + this->winFadeTimer;
    }
    olc::v2d_generic<float>::v2d_generic(&local_86c,0.0,0.0);
    iVar3 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar5 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    olc::v2d_generic<float>::v2d_generic(&local_874,(float)iVar3,(float)iVar5);
    local_878.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1)
         olc::PixelF(0.0,0.0,0.0,this->winFadeTimer / 2.0);
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,&local_86c,&local_874,(Pixel)local_878.field_1);
    if (2.0 <= this->winFadeTimer) {
      this->state = WIN;
    }
    break;
  case WIN:
    olc::v2d_generic<float>::v2d_generic(&local_880,0.0,0.0);
    pDVar10 = olc::Renderable::operator_cast_to_Decal_(&this->background);
    olc::v2d_generic<float>::v2d_generic(&local_888,1.0,1.0);
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,&local_880,pDVar10,&local_888,
               (Pixel *)&olc::WHITE.field_1);
  }
  return true;
}

Assistant:

bool Game::OnUserUpdate(float fElapsedTime) {
    switch(state) {
	case CurrentState::MENU:
	    {
		const auto mousePos = GetMousePos();
		if (mousePos.x >= ScreenWidth() / 2 - 50 && mousePos.x <= ScreenWidth() / 2 + 50 &&
			mousePos.y >= ScreenHeight() / 2 - 10 && mousePos.y <= ScreenHeight() / 2 + 10 &&
			GetMouse(0).bPressed &&
			!started) {
		    started = true;
		}
		if (started) {
		    menuFadeTimer += fElapsedTime;
		}
		if (menuFadeTimer >= 2.0f) {
		    state = CurrentState::FIRST_PHASE;
		}
		DrawStringDecal(
			olc::vf2d{float(ScreenWidth() / 2), 40.0f} -
			GetTextSize("The Great\n   MMO  \n Machine "),
			"The Great\n   MMO  \n Machine ",
			olc::BLUE,
			{2.0f, 2.0f});
		FillRectDecal(
			{ScreenWidth() / 2 - 50.0f, ScreenHeight() / 2 - 10.0f},
			{100.0f, 20.0f},
			olc::WHITE);
		DrawStringDecal(
			olc::vf2d{float(ScreenWidth() / 2), float(ScreenHeight() / 2)} -
			GetTextSize("Play") / 2,
			"Play",
			olc::BLUE);
		FillRectDecal({0.0f, 0.0f},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0.0f, 0.0f, 0.0f, menuFadeTimer / 2));
		break;
	    }
	case CurrentState::FIRST_PHASE:
	    {
		//Update
		switch (cutsceneState) {
		    case 0:
			currentSpeechBubble = SpeechBubble{
			    "Hmm, I really need a new\nvideo idea...",
			    "res/sounds/hmm.wav",
			    {70, ScreenHeight() - 64},
			    {ScreenWidth() - 76, 64},
			    speechBubbleSprite
			};
			currentSpeechBubble.play(soloud);
			cutsceneState = 1;
			break;
		    case 1:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    currentSpeechBubble = SpeechBubble{
				"I know, I'm gonna make an mmo",
				"res/sounds/iknow.wav",
				{70, ScreenHeight() - 64},
				{ScreenWidth() - 76, 64},
				speechBubbleSprite
			    };
			    currentSpeechBubble.play(soloud);
			    cutsceneState = 2;
			}
			break;
		    case 2:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    cutsceneState = 3;
			}
			break;
		    case 3:
			if (GetKey(olc::A).bPressed) {
			    aPressed = true;
			}
			if (GetKey(olc::D).bPressed && aPressed) {
			    statusBar.addWork();
			    aPressed = false;
			    pressCounter++;
			}
			if (pressCounter == 30) {
			    cutsceneState = 4;
			}
			break;
		    case 4:
			currentSpeechBubble = SpeechBubble{
			    "Eugh, this is going slowly",
			    "res/sounds/eughh.wav",
			    {70, ScreenHeight() - 64},
			    {ScreenWidth() - 76, 64},
			    speechBubbleSprite
			};
			currentSpeechBubble.play(soloud);
			cutsceneState = 5;
			break;
		    case 5:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    currentSpeechBubble = SpeechBubble{
				"I know, I'm gonna make an mmo\nmaking machine, there's no\nway that goes wrong",
				"res/sounds/mmo.wav",
				{70, ScreenHeight() - 64},
				{ScreenWidth() - 76, 64},
				speechBubbleSprite
			    };
			    currentSpeechBubble.play(soloud);
			    cutsceneState = 6;
			}
			break;
		    case 6:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    cutsceneState = 7;
			}
			break;
		    case 7:
			fadeoutTimer += fElapsedTime;
			if (fadeoutTimer >= 4.0f) {
			    state = CurrentState::MACHINE;
			}
			break;
		}
		currentSpeechBubble.tick(fElapsedTime);

		//Draw
		DrawDecal({0, ScreenHeight() - 64.0f}, javidBaseSprite, {2, 2});

		if (cutsceneState == 3) {
		    if (aPressed) {
			DrawDecal({float(ScreenWidth() / 2 - 40 - aButtonSprite.Sprite()->width),
				float(ScreenHeight() / 2 - aButtonSprite.Sprite()->height / 2)},
				aButtonPressedSprite);
			DrawDecal({float(ScreenWidth() / 2 + 40),
				float(ScreenHeight() / 2 - dButtonSprite.Sprite()->height / 2)},
				dButtonSprite);
			DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmDownSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmUpSprite, {2, 2});
		    } else {
			DrawDecal({float(ScreenWidth() / 2 - 40 - aButtonSprite.Sprite()->width),
				float(ScreenHeight() / 2 - aButtonSprite.Sprite()->height / 2)},
				aButtonSprite);
			DrawDecal({float(ScreenWidth() / 2 + 40),
				float(ScreenHeight() / 2 - dButtonSprite.Sprite()->height / 2)},
				dButtonPressedSprite);
			DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmUpSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmDownSprite, {2, 2});
		    }
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmDownSprite, {2, 2});
		    DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmDownSprite, {2, 2});
		    currentSpeechBubble.drawSelf(this);
		}

		statusBar.drawSelf(this);

		float fadeoutColor = std::min(3.0f, fadeoutTimer) / 3.0f;

		FillRectDecal({0.0f, 0.0f},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0.0f, 0.0f, 0.0f, fadeoutColor));

		break;
	    }
	case CurrentState::MACHINE:
	    {
		//Update
		minigameTimer -= fElapsedTime;
		if (minigameTimer <= 0.0f) {
		    minigameTimer = 10.0f;
		    int nextMinigame = minigameDistrib(engine);
		    while (nextMinigame == curMinigameId) {
			nextMinigame = minigameDistrib(engine);
		    }
		    currentMinigame = minigames[nextMinigame];
		    curMinigameId = nextMinigame;
		    currentMinigame->start();
		}
		armSwitchTimer += fElapsedTime;
		headBobTimer += fElapsedTime;
		currentMinigame->tick(this, internetPoints);
		if (internetPoints < 0) {
		    internetPoints = 0;
		}
		if (skillTree.tick(this, internetPoints)) {
		    armSwitchPeriod *= 0.7f;
		}
		statusBar.tick(this);
		//Draw
		if (headBobTimer <= headBobPeriod / 2) {
		    DrawDecal({0, ScreenHeight() - 64.0f}, robotBaseSprite0, {2, 2});
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, robotBaseSprite1, {2, 2});
		}
		if (headBobTimer >= headBobPeriod) {
		    headBobTimer -= headBobPeriod;
		}

		if (armSwitchPeriod >= 0.016) {
		    if (armSwitchTimer <= armSwitchPeriod / 2) {
			DrawDecal({0, ScreenHeight() - 64.0f}, robotRArmDownSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, robotLArmUpSprite, {2, 2});
		    } else {
			DrawDecal({0, ScreenHeight() - 64.0f}, robotRArmUpSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, robotLArmDownSprite, {2, 2});
		    }
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, fastHandSprites[rand() % 3], {2, 2});
		}
		while (armSwitchTimer >= armSwitchPeriod) {
		    armSwitchTimer -= armSwitchPeriod;
		    statusBar.addWork();
		}

		currentMinigame->drawSelf(this);

		DrawDecal({0, 5}, ipSprite);
		DrawStringDecal({16, 9}, std::to_string(internetPoints));
		
		skillTree.drawSelf(this, internetPoints);
		statusBar.drawSelf(this);

		if (statusBar.done()) {
		    winFadeTimer += fElapsedTime;
		}

		FillRectDecal({0, 0},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0, 0, 0, winFadeTimer / 2));

		if (winFadeTimer >= 2.0f) {
		    state = CurrentState::WIN;
		}
		break;
	    }
	case CurrentState::WIN:
	    {
		DrawDecal({0, 0}, background);
		break;
	    }
    }
    return true;
}